

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O0

bool __thiscall de::FilePath::beginsWithDrive(FilePath *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int local_1c;
  int ndx;
  FilePath *this_local;
  
  local_1c = 0;
  while( true ) {
    iVar2 = std::__cxx11::string::length();
    if (iVar2 <= local_1c) {
      return false;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
    if ((*pcVar3 == ':') && (iVar2 = std::__cxx11::string::length(), local_1c + 1 < iVar2)) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
      bVar1 = isSeparator(*pcVar3);
      if (bVar1) {
        return true;
      }
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
    bVar1 = isSeparator(*pcVar3);
    if (bVar1) break;
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

bool FilePath::beginsWithDrive (void) const
{
	for (int ndx = 0; ndx < (int)m_path.length(); ndx++)
	{
		if (m_path[ndx] == ':' && ndx+1 < (int)m_path.length() && isSeparator(m_path[ndx+1]))
			return true; // First part is drive letter.
		if (isSeparator(m_path[ndx]))
			return false;
	}
	return false;
}